

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-item-wear.c
# Opt level: O0

_Bool borg_best_stuff(void)

{
  byte bVar1;
  bool bVar2;
  _Bool _Var3;
  uint16_t uVar4;
  uint8_t *best_00;
  uint8_t *test_00;
  char *pcVar5;
  borg_item_conflict *pbStack_30;
  _Bool found;
  borg_item_conflict *item;
  uint8_t *best;
  uint8_t *test;
  int i;
  int32_t value;
  int k;
  
  if (shop_num == 7) {
    if (borg.goal.do_best) {
      _Var3 = borg_home_full();
      if ((_Var3) || (_Var3 = borg_inventory_full(), _Var3)) {
        value._3_1_ = false;
      }
      else if ((borg.goal.do_best & 1U) == 0) {
        value._3_1_ = false;
      }
      else {
        best_00 = (uint8_t *)mem_alloc((ulong)z_info->equip_slots_max);
        test_00 = (uint8_t *)mem_alloc((ulong)z_info->equip_slots_max);
        for (i = 0; i < (int)(uint)z_info->equip_slots_max; i = i + 1) {
          test_00[i] = 0xff;
          best_00[i] = 0xff;
        }
        test._4_4_ = borg.power;
        borg_best_stuff_aux(0,test_00,best_00,(int32_t *)((long)&test + 4));
        borg_notice(true);
        borg.goal.best_item = (borg_best *)mem_zalloc((ulong)z_info->equip_slots_max * 6);
        bVar2 = false;
        for (i = 0; i < (int)(uint)z_info->equip_slots_max; i = i + 1) {
          bVar1 = best_00[i];
          test._0_4_ = (uint)bVar1;
          uVar4 = borg_best_stuff_order(i);
          if (((uint)bVar1 != (uint)uVar4) && ((uint)test != 0xff)) {
            bVar2 = true;
            if ((int)(uint)test < 100) {
              pbStack_30 = borg_items + (int)(uint)test;
            }
            else {
              pbStack_30 = borg_shops[7].ware + (int)((uint)test - 100);
              borg.goal.best_item[i].home = true;
            }
            borg.goal.best_item[i].tval = pbStack_30->tval;
            borg.goal.best_item[i].pval = pbStack_30->pval;
            borg.goal.best_item[i].sval = pbStack_30->sval;
          }
        }
        if (!bVar2) {
          borg_clear_best();
        }
        borg.goal.do_best = false;
        if (*borg_cfg != 0) {
          if (bVar2) {
            for (test._0_4_ = 0; (int)(uint)test < (int)(uint)z_info->equip_slots_max;
                test._0_4_ = (uint)test + 1) {
              if (best_00[(int)(uint)test] < 0x65) {
                pcVar5 = format("new best: %s",borg_items + best_00[(int)(uint)test]);
                borg_note(pcVar5);
              }
              else {
                pcVar5 = format("new best: %s",
                                borg_shops[7].ware + (int)(best_00[(int)(uint)test] - 100));
                borg_note(pcVar5);
              }
            }
          }
          else {
            borg_note("new best: no changes");
          }
        }
        mem_free(best_00);
        mem_free(test_00);
        value._3_1_ = borg_one_step_wearing_best(0);
      }
    }
    else {
      value._3_1_ = borg_one_step_wearing_best(0);
    }
  }
  else {
    value._3_1_ = false;
  }
  return value._3_1_;
}

Assistant:

bool borg_best_stuff(void)
{
    int k;

    int32_t value;

    int i;

    uint8_t *test;
    uint8_t *best;

    /* only do this at home */
    if (shop_num != BORG_HOME)
        return false;

    /* if we don't need to do "best", check if we need to process the list */
    if (!borg.goal.do_best)
        return borg_one_step_wearing_best(0);

    /* must have a free inventory slot and a free home slot */
    if (borg_home_full() || borg_inventory_full())
        return false;

    /* only do this once per trip to town */
    if (!borg.goal.do_best)
        return false;

    best = mem_alloc(sizeof(uint8_t) * z_info->equip_slots_max);
    test = mem_alloc(sizeof(uint8_t) * z_info->equip_slots_max);
    /* Hack -- Initialize */
    for (k = 0; k < z_info->equip_slots_max; k++) {
        /* Initialize */
        best[k] = test[k] = 255;
    }

    /* Evaluate the inventory */
    value = borg.power;

    /* Determine the best possible equipment */
    (void)borg_best_stuff_aux(0, test, best, &value);

    /* Restore bonuses */
    borg_notice(true);

    /* convert the list into a list of items we can find even if they */
    /* change locations due to picking up and dropping items */
    /* Make first change. */
    borg_item *item;
    borg.goal.best_item
        = mem_zalloc(sizeof(struct borg_best) * z_info->equip_slots_max);
    bool found = false;
    for (k = 0; k < z_info->equip_slots_max; k++) {
        /* Get choice */
        i = best[k];

        /* Ignore non-changes */
        if (i == borg_best_stuff_order(k) || 255 == i)
            continue;

        found = true;
        if (i < 100) {
            item = &borg_items[i];
        } else {
            item = &borg_shops[BORG_HOME].ware[i - 100];
            borg.goal.best_item[k].home = true;
        }

        /* hopefully this is enough to get a unique item */
        borg.goal.best_item[k].tval = item->tval;
        borg.goal.best_item[k].pval = item->pval;
        borg.goal.best_item[k].sval = item->sval;
    }
    /* if we didn't change anything, clear out the changes */
    if (!found)
        borg_clear_best();

    /* we have done our best optimization.  */
    borg.goal.do_best = false;

    /* if we are being super chatty, spit out the new list of best */
    if (borg_cfg[BORG_VERBOSE]) {
        if (found) {
            for (i = 0; i < z_info->equip_slots_max; i++) {
                if (best[i] > 100) {
                    borg_note(format("new best: %s",
                        borg_shops[BORG_HOME].ware[best[i] - 100].desc));
                } else {
                    borg_note(format("new best: %s", borg_items[best[i]].desc));
                }
            }
        } else {
            borg_note("new best: no changes");
        }
    }
    mem_free(best);
    best = NULL;
    mem_free(test);
    test = NULL;

    return borg_one_step_wearing_best(0);
}